

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::egl::anon_unknown_1::SharedContextResetCase::iterate(SharedContextResetCase *this)

{
  EglTestContext *eglTestCtx;
  TestLog *log_00;
  MessageBuilder *pMVar1;
  InfiniteLoop *this_00;
  ShaderType *pSVar2;
  ContextReset *pCVar3;
  Error *error;
  undefined1 local_1f80 [8];
  UniquePtr<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
  contextReset;
  Functions gl;
  undefined1 local_540 [8];
  RenderingContext contextB;
  EGLContext local_390;
  undefined1 local_388 [8];
  RenderingContext contextA;
  EGLint aEStack_1d8 [2];
  EGLint attribListShared [9];
  MessageBuilder local_1a0;
  TestLog *local_20;
  TestLog *log;
  SharedContextResetCase *this_local;
  
  log = (TestLog *)this;
  local_20 = tcu::TestContext::getLog
                       ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1a0,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<
                     (&local_1a0,
                      (char (*) [89])
                      "A reset in one context will result in a reset in all other contexts in its share group\n\n"
                     );
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  attribListShared[2] = 0x30bf;
  attribListShared[3] = 1;
  attribListShared[4] = 0x3138;
  attribListShared[5] = 0x31bf;
  aEStack_1d8[0] = 0x3098;
  aEStack_1d8[1] = 3;
  attribListShared[0] = 0x30fb;
  attribListShared[1] = 1;
  attribListShared[6] = 0x3038;
  RobustnessTestCase::checkRequiredEGLExtensions(&this->super_RobustnessTestCase,aEStack_1d8);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&contextA.m_context,local_20,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&contextA.m_context,
                      (char (*) [50])"Create context A (share_context = EGL_NO_CONTEXT)");
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&contextA.m_context);
  local_390 = (EGLContext)0x0;
  RenderingContext::RenderingContext
            ((RenderingContext *)local_388,
             (this->super_RobustnessTestCase).super_TestCase.m_eglTestCtx,aEStack_1d8,
             &(this->super_RobustnessTestCase).m_eglConfig,
             &(this->super_RobustnessTestCase).m_eglDisplay,&local_390);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&contextB.m_context,local_20,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&contextB.m_context,
                      (char (*) [45])"Create context B (share_context = context A)");
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&contextB.m_context);
  eglTestCtx = (this->super_RobustnessTestCase).super_TestCase.m_eglTestCtx;
  gl.waitSync = (glWaitSyncFunc)RenderingContext::getContext((RenderingContext *)local_388);
  RenderingContext::RenderingContext
            ((RenderingContext *)local_540,eglTestCtx,aEStack_1d8,
             &(this->super_RobustnessTestCase).m_eglConfig,
             &(this->super_RobustnessTestCase).m_eglDisplay,&gl.waitSync);
  RenderingContext::makeCurrent
            ((RenderingContext *)local_388,&(this->super_RobustnessTestCase).m_eglSurface);
  glw::Functions::Functions
            ((Functions *)
             &contextReset.
              super_UniqueBase<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
              .m_data.field_0x8);
  RenderingContext::initGLFunctions
            ((RenderingContext *)local_388,
             (Functions *)
             &contextReset.
              super_UniqueBase<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
              .m_data.field_0x8);
  checkRequiredGLRobustnessExtension
            (aEStack_1d8,
             (Functions *)
             &contextReset.
              super_UniqueBase<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
              .m_data.field_0x8);
  this_00 = (InfiniteLoop *)operator_new(0x48);
  log_00 = local_20;
  pSVar2 = RobustnessTestCase::Params::getShaderType(&(this->super_RobustnessTestCase).m_params);
  InfiniteLoop::InfiniteLoop
            (this_00,(Functions *)
                     &contextReset.
                      super_UniqueBase<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
                      .m_data.field_0x8,log_00,*pSVar2);
  de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>::DefaultDeleter
            ((DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset> *)((long)&error + 7));
  de::details::
  UniquePtr<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
  ::UniquePtr((UniquePtr<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
               *)local_1f80);
  pCVar3 = de::details::
           UniqueBase<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
           ::operator->((UniqueBase<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
                         *)local_1f80);
  (*pCVar3->_vptr_ContextReset[2])();
  pCVar3 = de::details::
           UniqueBase<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
           ::operator->((UniqueBase<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
                         *)local_1f80);
  (*pCVar3->_vptr_ContextReset[3])();
  pCVar3 = de::details::
           UniqueBase<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
           ::operator->((UniqueBase<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
                         *)local_1f80);
  (*pCVar3->_vptr_ContextReset[4])();
  pCVar3 = de::details::
           UniqueBase<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
           ::operator->((UniqueBase<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
                         *)local_1f80);
  ContextReset::finish(pCVar3);
  tcu::TestContext::setTestResult
            ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             ,QP_TEST_RESULT_PASS,"Pass");
  this_local._4_4_ = STOP;
  de::details::
  UniquePtr<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
  ::~UniquePtr((UniquePtr<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
                *)local_1f80);
  RenderingContext::~RenderingContext((RenderingContext *)local_540);
  RenderingContext::~RenderingContext((RenderingContext *)local_388);
  return this_local._4_4_;
}

Assistant:

TestCase::IterateResult	iterate	(void)
	{
		TestLog&	log		= m_testCtx.getLog();

		log << tcu::TestLog::Message
			<< "A reset in one context will result in a reset in all other contexts in its share group\n\n"
			<< tcu::TestLog::EndMessage;

		// Create two share contexts with the same reset notification strategies
		const EGLint attribListShared[] =
		{
			EGL_CONTEXT_CLIENT_VERSION, 3,
			EGL_CONTEXT_MINOR_VERSION_KHR, 1,
			EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT, EGL_TRUE,
			EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_EXT, EGL_LOSE_CONTEXT_ON_RESET,
			EGL_NONE
		};

		checkRequiredEGLExtensions(attribListShared);

		log << tcu::TestLog::Message << "Create context A (share_context = EGL_NO_CONTEXT)" << tcu::TestLog::EndMessage;
		RenderingContext contextA(m_eglTestCtx, attribListShared, m_eglConfig, m_eglDisplay, EGL_NO_CONTEXT);

		log << tcu::TestLog::Message << "Create context B (share_context = context A)" << tcu::TestLog::EndMessage;
		RenderingContext contextB(m_eglTestCtx, attribListShared, m_eglConfig, m_eglDisplay, contextA.getContext());

		contextA.makeCurrent(m_eglSurface);

		glw::Functions gl;
		contextA.initGLFunctions(&gl);
		checkRequiredGLRobustnessExtension(attribListShared, gl);

		DE_ASSERT(m_params.getContextResetType() == CONTEXTRESETTYPE_INFINITE_LOOP);
		de::UniquePtr<ContextReset> contextReset(new InfiniteLoop(gl, log, m_params.getShaderType()));

		contextReset->setup();
		contextReset->draw();

		try
		{
			contextReset->teardown();
			contextReset->finish();
		}
		catch (const glu::Error& error)
		{
			if (error.getError() == GL_CONTEXT_LOST)
			{
				contextB.makeCurrent(m_eglSurface);

				contextB.initGLFunctions(&gl);
				gl.getString(GL_VERSION); // arbitrary gl call

				if (gl.getError() != GL_CONTEXT_LOST)
				{
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Test failed! glGetError() returned wrong value. Expected GL_CONTEXT_LOST in context B");
					return STOP;
				}
			}
			else
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Test failed! glGetError() returned wrong value. Expected GL_CONTEXT_LOST in context A");
				return STOP;
			}
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}